

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_8_1_a8b376e8 gcFrame;
  sysbvm_tuple_t local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_tuple_t *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &local_50;
  local_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 1;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_50 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x28));
  sysbvm_methodDictionary_atPut
            (context,*(sysbvm_tuple_t *)(arguments[1] + 0x18),*(sysbvm_tuple_t *)(*arguments + 0x30)
             ,local_50);
  sysbvm_stackFrame_popRecord(&local_48);
  sVar1 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astUseNamedSlotsOfNode_t **usedNamedSlots = (sysbvm_astUseNamedSlotsOfNode_t**)node;
    struct {
        sysbvm_tuple_t tuple;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.tuple = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*usedNamedSlots)->tupleExpression);
    sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*usedNamedSlots)->binding, gcFrame.tuple);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}